

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O0

int http_message_needs_eof_(http_parser *parser)

{
  http_parser *parser_local;
  
  if ((undefined1  [32])((undefined1  [32])*parser & (undefined1  [32])0x3) == (undefined1  [32])0x0
     ) {
    parser_local._4_4_ = 0;
  }
  else if ((((parser->status_code / 100 == 1) || (parser->status_code == 0xcc)) ||
           (parser->status_code == 0x130)) || ((*(byte *)parser >> 2 & 0x20) != 0)) {
    parser_local._4_4_ = 0;
  }
  else if (((*(byte *)parser >> 2 & 1) == 0) && (parser->content_length == 0xffffffffffffffff)) {
    parser_local._4_4_ = 1;
  }
  else {
    parser_local._4_4_ = 0;
  }
  return parser_local._4_4_;
}

Assistant:

int
http_message_needs_eof_ (const http_parser *parser)
{
  if (parser->type == HTTP_REQUEST) {
    return 0;
  }

  /* See RFC 2616 section 4.4 */
  if (parser->status_code / 100 == 1 || /* 1xx e.g. Continue */
      parser->status_code == 204 ||     /* No Content */
      parser->status_code == 304 ||     /* Not Modified */
      parser->flags & F_SKIPBODY) {     /* response to a HEAD request */
    return 0;
  }

  if ((parser->flags & F_CHUNKED) || parser->content_length != ULLONG_MAX) {
    return 0;
  }

  return 1;
}